

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 GenStateCompileSwitchBlock(jx9_gen_state *pGen,sxu32 *pBlockStart)

{
  byte bVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  SyToken *pSVar4;
  SyToken *pSVar5;
  
  pSVar5 = pGen->pIn;
  pSVar4 = pGen->pEnd;
  sVar3 = 0;
  if (pSVar5 < pSVar4) {
    bVar1 = *(byte *)((long)&pSVar5->nType + 2);
    sVar3 = 0;
    while ((bVar1 & 0x14) == 0) {
      sVar3 = jx9GenCompileError(pGen,1,pSVar5->nLine,"Unexpected token \'%z\'");
      if (sVar3 == -10) {
        return -10;
      }
      pSVar2 = pGen->pIn;
      pSVar4 = pGen->pEnd;
      pSVar5 = pSVar2 + 1;
      pGen->pIn = pSVar5;
      if (pSVar4 <= pSVar5) break;
      bVar1 = *(byte *)((long)&pSVar2[1].nType + 2);
    }
  }
  pSVar5 = pSVar5 + 1;
  pGen->pIn = pSVar5;
  *pBlockStart = pGen->pVm->pByteContainer->nUsed;
  if (pSVar5 < pSVar4) {
    do {
      if ((pSVar5->nType & 4) == 0) {
        if ((char)pSVar5->nType < '\0') {
          return -0x12;
        }
      }
      else {
        if (*(int *)&pSVar5->pUserData == 5) {
          return 0;
        }
        if (*(int *)&pSVar5->pUserData == 10) {
          return 0;
        }
      }
      sVar3 = jx9CompileBlock(pGen);
      if (sVar3 == -10) {
        return -10;
      }
      pSVar5 = pGen->pIn;
    } while (pSVar5 < pGen->pEnd);
  }
  return sVar3;
}

Assistant:

static sxi32 GenStateCompileSwitchBlock(jx9_gen_state *pGen,sxu32 *pBlockStart)
{
	sxi32 rc = SXRET_OK;
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_COLON/*':'*/)) == 0 ){
		/* Unexpected token */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		pGen->pIn++;
	}
	pGen->pIn++;
	/* First instruction to execute in this block. */
	*pBlockStart = jx9VmInstrLength(pGen->pVm);
	/* Compile the block until we hit a case/default/endswitch keyword
	 * or the '}' token */
	for(;;){
		if( pGen->pIn >= pGen->pEnd ){
			/* No more input to process */
			break;
		}
		rc = SXRET_OK;
		if( (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			if( pGen->pIn->nType & JX9_TK_CCB /*'}' */ ){
				rc = SXERR_EOF;
				break;
			}
		}else{
			sxi32 nKwrd;
			/* Extract the keyword */
			nKwrd = SX_PTR_TO_INT(pGen->pIn->pUserData);
			if( nKwrd == JX9_TKWRD_CASE || nKwrd == JX9_TKWRD_DEFAULT ){
				break;
			}
		}
		/* Compile block */
		rc = jx9CompileBlock(&(*pGen));
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
	}
	return rc;
}